

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gitlike.cxx
# Opt level: O2

int main(int argc,char **argv)

{
  char cVar1;
  const_iterator __args_1;
  ostream *poVar2;
  long lVar3;
  initializer_list<args::EitherFlag> in;
  initializer_list<args::EitherFlag> in_00;
  initializer_list<args::EitherFlag> in_01;
  allocator local_a52;
  allocator local_a51;
  Error e;
  string local_a28;
  _Any_data local_a08;
  undefined8 local_9f8;
  undefined8 uStack_9f0;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  args;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_9d0;
  MapPositional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,___gnu_cxx::__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,___gnu_cxx::__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>)>,_args::ValueReader,_args::detail::unordered_map>
  command;
  ValueFlag<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_args::ValueReader>
  htmlpath;
  unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,___gnu_cxx::__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,___gnu_cxx::__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>)>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,___gnu_cxx::__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,___gnu_cxx::__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>)>_>_>_>
  map;
  Flag version;
  HelpFlag help;
  ArgumentParser parser;
  
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,___gnu_cxx::__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,___gnu_cxx::__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>)>_>
  ::
  pair<const_char_(&)[5],_void_(&)(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,___gnu_cxx::__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,___gnu_cxx::__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>),_true>
            ((pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,___gnu_cxx::__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,___gnu_cxx::__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>)>_>
              *)&parser,(char (*) [5])0x11515c,Init);
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,___gnu_cxx::__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,___gnu_cxx::__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>)>_>
  ::
  pair<const_char_(&)[4],_void_(&)(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,___gnu_cxx::__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,___gnu_cxx::__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>),_true>
            ((pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,___gnu_cxx::__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,___gnu_cxx::__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>)>_>
              *)&parser.super_Command.super_Group.children.
                 super__Vector_base<args::Base_*,_std::allocator<args::Base_*>_>._M_impl.
                 super__Vector_impl_data._M_end_of_storage,(char (*) [4])0x115077,Add);
  std::
  _Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::function<void(std::__cxx11::string_const&,__gnu_cxx::__normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,__gnu_cxx::__normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>)>>,std::allocator<std::pair<std::__cxx11::string_const,std::function<void(std::__cxx11::string_const&,__gnu_cxx::__normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,__gnu_cxx::__normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>)>>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
  ::
  _Hashtable<std::pair<std::__cxx11::string_const,std::function<void(std::__cxx11::string_const&,__gnu_cxx::__normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,__gnu_cxx::__normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>)>>const*>
            ((_Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::function<void(std::__cxx11::string_const&,__gnu_cxx::__normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,__gnu_cxx::__normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>)>>,std::allocator<std::pair<std::__cxx11::string_const,std::function<void(std::__cxx11::string_const&,__gnu_cxx::__normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,__gnu_cxx::__normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>)>>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
              *)&map,&parser,(undefined1 *)((long)&parser.super_Command.name.field_2 + 8),0,
             &htmlpath,&command,&help);
  lVar3 = 0x40;
  do {
    std::
    pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,___gnu_cxx::__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,___gnu_cxx::__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>)>_>
    ::~pair((pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,___gnu_cxx::__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,___gnu_cxx::__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>)>_>
             *)((long)&parser.super_Command.super_Group.super_Base._vptr_Base + lVar3));
    lVar3 = lVar3 + -0x40;
  } while (lVar3 != -0x40);
  std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::vector<char**,void>
            ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&args,argv + 1,
             argv + argc,(allocator_type *)&parser);
  std::__cxx11::string::string((string *)&htmlpath,"This is a git-like program",(allocator *)&help);
  std::__cxx11::string::string
            ((string *)&command,"Valid commands are init and add",(allocator *)&version);
  ::args::ArgumentParser::ArgumentParser(&parser,(string *)&htmlpath,(string *)&command);
  std::__cxx11::string::~string((string *)&command);
  std::__cxx11::string::~string((string *)&htmlpath);
  std::__cxx11::string::string((string *)&version,"help",(allocator *)&local_a28);
  std::__cxx11::string::string
            ((string *)&e,"Display this help menu",(allocator *)local_a08._M_pod_data);
  command.super_PositionalBase.super_NamedBase.super_Base._8_8_ =
       &command.super_PositionalBase.super_NamedBase.super_Base.help._M_string_length;
  command.super_PositionalBase.super_NamedBase.super_Base._vptr_Base._0_2_ = 0x6801;
  command.super_PositionalBase.super_NamedBase.super_Base.help._M_dataplus._M_p = (pointer)0x0;
  command.super_PositionalBase.super_NamedBase.super_Base.help._M_string_length._0_1_ = 0;
  ::args::EitherFlag::EitherFlag
            ((EitherFlag *)
             ((long)&command.super_PositionalBase.super_NamedBase.super_Base.help.field_2 + 8),
             "help");
  in._M_len = 2;
  in._M_array = (iterator)&command;
  ::args::Matcher::Matcher((Matcher *)&htmlpath,in);
  ::args::HelpFlag::HelpFlag
            (&help,(Group *)&parser,(string *)&version,(string *)&e,(Matcher *)&htmlpath,None);
  ::args::Matcher::~Matcher((Matcher *)&htmlpath);
  lVar3 = 0x30;
  do {
    std::__cxx11::string::~string
              ((string *)
               ((long)&command.super_PositionalBase.super_NamedBase.super_Base._vptr_Base + lVar3));
    lVar3 = lVar3 + -0x28;
  } while (lVar3 != -0x20);
  std::__cxx11::string::~string((string *)&e);
  std::__cxx11::string::~string((string *)&version);
  std::__cxx11::string::string((string *)&htmlpath,*argv,(allocator *)&command);
  std::__cxx11::string::_M_assign((string *)&parser.helpParams.programName);
  std::__cxx11::string::~string((string *)&htmlpath);
  std::__cxx11::string::string((string *)&htmlpath,"{command options}",(allocator *)&command);
  std::__cxx11::string::_M_assign((string *)&parser.super_Command.proglinePostfix);
  std::__cxx11::string::~string((string *)&htmlpath);
  std::__cxx11::string::string((string *)&e,"version",(allocator *)local_a08._M_pod_data);
  std::__cxx11::string::string
            ((string *)&local_a28,"Show the version of this program",(allocator *)&local_9d0);
  ::args::EitherFlag::EitherFlag((EitherFlag *)&command,"version");
  in_00._M_len = 1;
  in_00._M_array = (iterator)&command;
  ::args::Matcher::Matcher((Matcher *)&htmlpath,in_00);
  ::args::Flag::Flag(&version,(Group *)&parser,(string *)&e,&local_a28,(Matcher *)&htmlpath,None);
  ::args::Matcher::~Matcher((Matcher *)&htmlpath);
  std::__cxx11::string::~string
            ((string *)&command.super_PositionalBase.super_NamedBase.super_Base.options);
  std::__cxx11::string::~string((string *)&local_a28);
  std::__cxx11::string::~string((string *)&e);
  std::__cxx11::string::string((string *)&local_a28,"html-path",&local_a52);
  std::__cxx11::string::string((string *)local_a08._M_pod_data,"Specify the html path",&local_a51);
  ::args::EitherFlag::EitherFlag((EitherFlag *)&e,"html-path");
  in_01._M_len = 1;
  in_01._M_array = (iterator)&e;
  ::args::Matcher::Matcher((Matcher *)&command,in_01);
  local_9d0._M_dataplus._M_p = (pointer)&local_9d0.field_2;
  local_9d0._M_string_length = 0;
  local_9d0.field_2._M_local_buf[0] = '\0';
  ::args::
  ValueFlag<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_args::ValueReader>
  ::ValueFlag(&htmlpath,(Group *)&parser,&local_a28,(string *)&local_a08,(Matcher *)&command,
              &local_9d0,None);
  std::__cxx11::string::~string((string *)&local_9d0);
  ::args::Matcher::~Matcher((Matcher *)&command);
  std::__cxx11::string::~string((string *)&e.field_0x8);
  std::__cxx11::string::~string((string *)local_a08._M_pod_data);
  std::__cxx11::string::~string((string *)&local_a28);
  std::__cxx11::string::string((string *)&e,"command",(allocator *)&local_9d0);
  std::__cxx11::string::string((string *)&local_a28,"Command to execute",&local_a52);
  local_9f8 = 0;
  uStack_9f0 = 0;
  local_a08._M_unused._M_object = (void *)0x0;
  local_a08._8_8_ = 0;
  ::args::
  MapPositional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,___gnu_cxx::__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,___gnu_cxx::__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>)>,_args::ValueReader,_args::detail::unordered_map>
  ::MapPositional(&command,(Group *)&parser,(string *)&e,&local_a28,&map,
                  (function<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,___gnu_cxx::__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,___gnu_cxx::__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>)>
                   *)&local_a08,None);
  std::_Function_base::~_Function_base((_Function_base *)&local_a08);
  std::__cxx11::string::~string((string *)&local_a28);
  std::__cxx11::string::~string((string *)&e);
  command.super_PositionalBase.super_NamedBase.super_Base._8_8_ =
       command.super_PositionalBase.super_NamedBase.super_Base._8_8_ | 0x20;
  __args_1 = ::args::ArgumentParser::
             ParseArgs<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
                       (&parser,&args);
  *(uint *)(std::runtime_error::runtime_error + *(long *)(std::cout + -0x18)) =
       *(uint *)(std::runtime_error::runtime_error + *(long *)(std::cout + -0x18)) | 1;
  poVar2 = std::operator<<((ostream *)&std::cout,"Before command options:");
  std::endl<char,std::char_traits<char>>(poVar2);
  poVar2 = std::operator<<((ostream *)&std::cout,"Version called: ");
  (*version.super_FlagBase.super_NamedBase.super_Base._vptr_Base[2])();
  poVar2 = std::ostream::_M_insert<bool>(SUB81(poVar2,0));
  std::endl<char,std::char_traits<char>>(poVar2);
  poVar2 = std::operator<<((ostream *)&std::cout,"html-path called: ");
  (*htmlpath.super_ValueFlagBase.super_FlagBase.super_NamedBase.super_Base._vptr_Base[2])();
  poVar2 = std::ostream::_M_insert<bool>(SUB81(poVar2,0));
  poVar2 = std::operator<<(poVar2,", value: ");
  poVar2 = std::operator<<(poVar2,(string *)&htmlpath.value);
  std::endl<char,std::char_traits<char>>(poVar2);
  cVar1 = (**(code **)(CONCAT62(command.super_PositionalBase.super_NamedBase.super_Base._vptr_Base.
                                _2_6_,command.super_PositionalBase.super_NamedBase.super_Base.
                                      _vptr_Base._0_2_) + 0x10))();
  if (cVar1 == '\0') {
    ::args::ArgumentParser::Help(&parser,(ostream *)&std::cout);
  }
  else {
    std::__cxx11::string::string((string *)&e,*argv,(allocator *)&local_a28);
    std::
    function<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,___gnu_cxx::__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,___gnu_cxx::__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>)>
    ::operator()(&command.value,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&e,
                 (__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                  )__args_1._M_current,
                 (__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                  )args.
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish);
    std::__cxx11::string::~string((string *)&e);
  }
  ::args::
  MapPositional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,___gnu_cxx::__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,___gnu_cxx::__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>)>,_args::ValueReader,_args::detail::unordered_map>
  ::~MapPositional(&command);
  ::args::
  ValueFlag<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_args::ValueReader>
  ::~ValueFlag(&htmlpath);
  ::args::FlagBase::~FlagBase(&version.super_FlagBase);
  ::args::FlagBase::~FlagBase((FlagBase *)&help);
  ::args::ArgumentParser::~ArgumentParser(&parser);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&args);
  std::_Hashtable<$8c854410$>::~_Hashtable(&map._M_h);
  return 0;
}

Assistant:

int main(int argc, char **argv)
{
    std::unordered_map<std::string, commandtype> map{
        {"init", Init},
        {"add", Add}};

    const std::vector<std::string> args(argv + 1, argv + argc);
    args::ArgumentParser parser("This is a git-like program", "Valid commands are init and add");
    args::HelpFlag help(parser, "help", "Display this help menu", {'h', "help"});
    parser.Prog(argv[0]);
    parser.ProglinePostfix("{command options}");
    args::Flag version(parser, "version", "Show the version of this program", {"version"});
    args::ValueFlag<std::string> htmlpath(parser, "html-path", "Specify the html path", {"html-path"});
    args::MapPositional<std::string, commandtype> command(parser, "command", "Command to execute", map);
    command.KickOut(true);
    try
    {
        auto next = parser.ParseArgs(args);
        std::cout << std::boolalpha;
        std::cout << "Before command options:" << std::endl;
        std::cout << "Version called: " << bool{version} << std::endl;
        std::cout << "html-path called: " << bool{htmlpath} << ", value: " << args::get(htmlpath) << std::endl;
        if (command)
        {
            args::get(command)(argv[0], next, std::end(args));
        } else
        {
            std::cout << parser;
        }
    }
    catch (args::Help)
    {
        std::cout << parser;
        return 0;
    }
    catch (args::Error e)
    {
        std::cerr << e.what() << std::endl;
        std::cerr << parser;
        return 1;
    }
    return 0;
}